

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# touzet_ted_test.cc
# Opt level: O0

int main(void)

{
  byte bVar1;
  bool bVar2;
  int k;
  ostream *poVar3;
  istream *piVar4;
  char *pcVar5;
  double __val;
  string local_d70;
  string local_d50;
  double local_d30;
  double computed_result;
  Node<label::StringLabel> t2;
  Node<label::StringLabel> t1;
  BracketNotationParser<label::StringLabel> bnp;
  double expected_result;
  undefined1 local_be8 [4];
  int k_value;
  string destination_tree;
  string source_tree;
  string line;
  TreeIndexAll ti2;
  TreeIndexAll ti1;
  TouzetDepthPruningTruncatedTreeFixTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
  touzet_algorithm;
  istream local_288 [8];
  ifstream test_cases_file;
  UnitCostModelLD<label::StringLabel> local_70;
  CostModel ucm;
  LabelDictionary ld;
  
  ld._84_4_ = 0;
  label::LabelDictionary<label::StringLabel>::LabelDictionary
            ((LabelDictionary<label::StringLabel> *)&ucm);
  cost_model::UnitCostModelLD<label::StringLabel>::UnitCostModelLD
            (&local_70,(LabelDictionary<label::StringLabel> *)&ucm);
  std::ifstream::ifstream(local_288,"touzet_ted_test_data.txt",8);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Error while opening file.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    ld._84_4_ = 0xffffffff;
  }
  else {
    ted::
    TouzetDepthPruningTruncatedTreeFixTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
    ::TEDAlgorithm((TouzetDepthPruningTruncatedTreeFixTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                    *)&ti1.super_PostLToLeftSibling.postl_to_left_sibling_.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_end_of_storage,&local_70);
    node::TreeIndexAll::TreeIndexAll
              ((TreeIndexAll *)
               &ti2.super_PostLToLeftSibling.postl_to_left_sibling_.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage);
    node::TreeIndexAll::TreeIndexAll((TreeIndexAll *)((long)&line.field_2 + 8));
    std::__cxx11::string::string((string *)(source_tree.field_2._M_local_buf + 8));
    do {
      do {
        piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           (local_288,(string *)(source_tree.field_2._M_local_buf + 8));
        bVar2 = std::ios::operator_cast_to_bool
                          ((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
        if (!bVar2) {
          touzet_algorithm.
          super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
          .
          super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
          .fd_.band_width_._4_4_ = 2;
          goto LAB_00104126;
        }
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)((long)&source_tree.field_2 + 8));
      } while (*pcVar5 != '#');
      poVar3 = std::operator<<((ostream *)&std::cout,"--- TEST ---");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<((ostream *)&std::cout,
                               (string *)(source_tree.field_2._M_local_buf + 8));
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                (local_288,(string *)(source_tree.field_2._M_local_buf + 8));
      std::__cxx11::string::string
                ((string *)(destination_tree.field_2._M_local_buf + 8),
                 (string *)(source_tree.field_2._M_local_buf + 8));
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                (local_288,(string *)(source_tree.field_2._M_local_buf + 8));
      std::__cxx11::string::string
                ((string *)local_be8,(string *)(source_tree.field_2._M_local_buf + 8));
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                (local_288,(string *)(source_tree.field_2._M_local_buf + 8));
      k = std::__cxx11::stoi((string *)((long)&source_tree.field_2 + 8),(size_t *)0x0,10);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                (local_288,(string *)(source_tree.field_2._M_local_buf + 8));
      __val = std::__cxx11::stod((string *)((long)&source_tree.field_2 + 8),(size_t *)0x0);
      parser::BracketNotationParser<label::StringLabel>::BracketNotationParser
                ((BracketNotationParser<label::StringLabel> *)((long)&t1.label_.label_.field_2 + 8))
      ;
      bVar2 = parser::BracketNotationParser<label::StringLabel>::validate_input
                        ((BracketNotationParser<label::StringLabel> *)
                         ((long)&t1.label_.label_.field_2 + 8),
                         (string *)((long)&destination_tree.field_2 + 8));
      if (bVar2) {
        bVar2 = parser::BracketNotationParser<label::StringLabel>::validate_input
                          ((BracketNotationParser<label::StringLabel> *)
                           ((long)&t1.label_.label_.field_2 + 8),(string *)local_be8);
        if (bVar2) {
          parser::BracketNotationParser<label::StringLabel>::parse_single
                    ((Node<label::StringLabel> *)((long)&t2.label_.label_.field_2 + 8),
                     (BracketNotationParser<label::StringLabel> *)
                     ((long)&t1.label_.label_.field_2 + 8),
                     (string *)((long)&destination_tree.field_2 + 8));
          parser::BracketNotationParser<label::StringLabel>::parse_single
                    ((Node<label::StringLabel> *)&computed_result,
                     (BracketNotationParser<label::StringLabel> *)
                     ((long)&t1.label_.label_.field_2 + 8),(string *)local_be8);
          node::
          index_tree<node::TreeIndexAll,label::StringLabel,cost_model::UnitCostModelLD<label::StringLabel>>
                    ((TreeIndexAll *)
                     &ti2.super_PostLToLeftSibling.postl_to_left_sibling_.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_end_of_storage,
                     (Node<label::StringLabel> *)((long)&t2.label_.label_.field_2 + 8),
                     (LabelDictionary<label::StringLabel> *)&ucm,&local_70);
          node::
          index_tree<node::TreeIndexAll,label::StringLabel,cost_model::UnitCostModelLD<label::StringLabel>>
                    ((TreeIndexAll *)((long)&line.field_2 + 8),
                     (Node<label::StringLabel> *)&computed_result,
                     (LabelDictionary<label::StringLabel> *)&ucm,&local_70);
          local_d30 = ted::
                      TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                      ::ted_k((TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                               *)&ti1.super_PostLToLeftSibling.postl_to_left_sibling_.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage,
                              (TreeIndexAll *)
                              &ti2.super_PostLToLeftSibling.postl_to_left_sibling_.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,
                              (TreeIndexAll *)((long)&line.field_2 + 8),k);
          if ((local_d30 != __val) || (NAN(local_d30) || NAN(__val))) {
            poVar3 = std::operator<<((ostream *)&std::cerr,"Incorrect ted result:\n");
            std::__cxx11::to_string(&local_d50,local_d30);
            poVar3 = std::operator<<(poVar3,(string *)&local_d50);
            poVar3 = std::operator<<(poVar3,"\ninstead of\n");
            std::__cxx11::to_string(&local_d70,__val);
            poVar3 = std::operator<<(poVar3,(string *)&local_d70);
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            std::__cxx11::string::~string((string *)&local_d70);
            std::__cxx11::string::~string((string *)&local_d50);
            poVar3 = std::operator<<((ostream *)&std::cerr,"for input trees: ");
            poVar3 = std::operator<<(poVar3,(string *)(destination_tree.field_2._M_local_buf + 8));
            poVar3 = std::operator<<(poVar3," | ");
            poVar3 = std::operator<<(poVar3,(string *)local_be8);
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            poVar3 = std::operator<<((ostream *)&std::cerr,"and k: ");
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,k);
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            ld._84_4_ = 0xffffffff;
            touzet_algorithm.
            super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
            .
            super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
            .fd_.band_width_._4_4_ = 1;
          }
          else {
            touzet_algorithm.
            super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
            .
            super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
            .fd_.band_width_._4_4_ = 0;
          }
          node::Node<label::StringLabel>::~Node((Node<label::StringLabel> *)&computed_result);
          node::Node<label::StringLabel>::~Node
                    ((Node<label::StringLabel> *)((long)&t2.label_.label_.field_2 + 8));
        }
        else {
          poVar3 = std::operator<<((ostream *)&std::cerr,"Incorrect format of input tree: \'");
          poVar3 = std::operator<<(poVar3,(string *)local_be8);
          poVar3 = std::operator<<(poVar3,"\'. Is the number of opening and closing brackets equal?"
                                  );
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          ld._84_4_ = 0xffffffff;
          touzet_algorithm.
          super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
          .
          super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
          .fd_.band_width_._4_4_ = 1;
        }
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Incorrect format of input tree: \'");
        poVar3 = std::operator<<(poVar3,(string *)(destination_tree.field_2._M_local_buf + 8));
        poVar3 = std::operator<<(poVar3,"\'. Is the number of opening and closing brackets equal?");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        ld._84_4_ = 0xffffffff;
        touzet_algorithm.
        super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
        .
        super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
        .fd_.band_width_._4_4_ = 1;
      }
      parser::BracketNotationParser<label::StringLabel>::~BracketNotationParser
                ((BracketNotationParser<label::StringLabel> *)((long)&t1.label_.label_.field_2 + 8))
      ;
      std::__cxx11::string::~string((string *)local_be8);
      std::__cxx11::string::~string((string *)(destination_tree.field_2._M_local_buf + 8));
    } while (touzet_algorithm.
             super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
             .
             super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
             .fd_.band_width_._4_4_ == 0);
LAB_00104126:
    std::__cxx11::string::~string((string *)(source_tree.field_2._M_local_buf + 8));
    if (touzet_algorithm.
        super_TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
        .
        super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
        .fd_.band_width_._4_4_ == 2) {
      ld._84_4_ = 0;
    }
    node::TreeIndexAll::~TreeIndexAll((TreeIndexAll *)((long)&line.field_2 + 8));
    node::TreeIndexAll::~TreeIndexAll
              ((TreeIndexAll *)
               &ti2.super_PostLToLeftSibling.postl_to_left_sibling_.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage);
    ted::
    TouzetDepthPruningTruncatedTreeFixTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
    ::~TouzetDepthPruningTruncatedTreeFixTreeIndex
              ((TouzetDepthPruningTruncatedTreeFixTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                *)&ti1.super_PostLToLeftSibling.postl_to_left_sibling_.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_end_of_storage);
  }
  std::ifstream::~ifstream(local_288);
  label::LabelDictionary<label::StringLabel>::~LabelDictionary
            ((LabelDictionary<label::StringLabel> *)&ucm);
  return ld._84_4_;
}

Assistant:

int main() {

  // Type aliases.
  using Label = label::StringLabel;
  using CostModel = cost_model::UnitCostModelLD<Label>;
  using LabelDictionary = label::LabelDictionary<Label>;
  
  // Initialise label dictionary - separate dictionary for each test tree
  // becuse it is easier to keep track of label ids.
  LabelDictionary ld;
  
  // Initialise cost model.
  CostModel ucm(ld);

  // Parse test cases from file.
  std::ifstream test_cases_file("touzet_ted_test_data.txt");
  if (!test_cases_file.is_open()) {
    std::cerr << "Error while opening file." << std::endl;
    return -1;
  }

  // Initialise Touzet's algorithm.
  ted::TouzetDepthPruningTruncatedTreeFixTreeIndex<CostModel, node::TreeIndexAll> touzet_algorithm(ucm);

  // Initialise two tree indexes.
  // Use TreeIndexAll that is a superset of all algorithms' indexes.
  node::TreeIndexAll ti1;
  node::TreeIndexAll ti2;

  for (std::string line; std::getline( test_cases_file, line);) {
    if (line[0] == '#') {
      std::cout << "--- TEST ---" << std::endl;
      std::cout << line << std::endl;
      
      std::getline(test_cases_file, line);
      std::string source_tree = line;
      std::getline(test_cases_file, line);
      std::string destination_tree = line;
      std::getline(test_cases_file, line);
      int k_value = std::stoi(line);
      
      std::getline(test_cases_file, line);
      double expected_result = std::stod(line);

      parser::BracketNotationParser<Label> bnp;

      // Validate test tree.
      if (!bnp.validate_input(source_tree)) {
        std::cerr << "Incorrect format of input tree: '" << source_tree << "'. Is the number of opening and closing brackets equal?" << std::endl;
        return -1;
      }
      // Validate test tree.
      if (!bnp.validate_input(destination_tree)) {
        std::cerr << "Incorrect format of input tree: '" << destination_tree << "'. Is the number of opening and closing brackets equal?" << std::endl;
        return -1;
      }
      // Parse test tree.
      node::Node<Label> t1 = bnp.parse_single(source_tree);
      node::Node<Label> t2 = bnp.parse_single(destination_tree);

      // Index input trees.
      node::index_tree(ti1, t1, ld, ucm);
      node::index_tree(ti2, t2, ld, ucm);

      // Execute the algorithm and get the result.
      double computed_result = touzet_algorithm.ted_k(ti1, ti2, k_value);

      if (computed_result != expected_result) {
        std::cerr << "Incorrect ted result:\n" << std::to_string(computed_result) << "\ninstead of\n" << std::to_string(expected_result) << std::endl;
        std::cerr << "for input trees: " << source_tree << " | " << destination_tree << std::endl;
        std::cerr << "and k: " << k_value << std::endl;
        return -1;
      }
    }
  }

  return 0;
}